

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplex.hpp
# Opt level: O2

bool __thiscall
soplex::
SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::getBoundViolation(SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    *this,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *maxviol,
                   number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *sumviol)

{
  bool bVar1;
  type_conflict5 tVar2;
  ulong uVar3;
  int i;
  ulong uVar4;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  upper;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  lower;
  cpp_dec_float<50U,_int,_void> local_118;
  ulong local_e0;
  cpp_dec_float<50U,_int,_void> local_d8;
  cpp_dec_float<50U,_int,_void> local_a0;
  cpp_dec_float<50U,_int,_void> local_68;
  
  bVar1 = isPrimalFeasible(this);
  if (bVar1) {
    _syncRealSolution(this);
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)maxviol,0.0);
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)sumviol,0.0);
    uVar4 = (ulong)(uint)(this->_realLP->
                         super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ).
                         super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         .set.thenum;
    while (0 < (int)uVar4) {
      i = (int)uVar4 + -1;
      SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::lowerUnscaled((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)&local_68,this->_realLP,i);
      SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::upperUnscaled((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)&local_a0,this->_realLP,i);
      uVar3 = uVar4 - 1 & 0xffffffff;
      local_118.fpclass = cpp_dec_float_finite;
      local_118.prec_elem = 10;
      local_118.data._M_elems[0] = 0;
      local_118.data._M_elems[1] = 0;
      local_118.data._M_elems[2] = 0;
      local_118.data._M_elems[3] = 0;
      local_118.data._M_elems[4] = 0;
      local_118.data._M_elems[5] = 0;
      local_118.data._M_elems._24_5_ = 0;
      local_118.data._M_elems[7]._1_3_ = 0;
      local_118.data._M_elems._32_5_ = 0;
      local_118.data._M_elems[9]._1_3_ = 0;
      local_118.exp = 0;
      local_118.neg = false;
      local_e0 = uVar4 - 1;
      boost::multiprecision::default_ops::
      eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                (&local_118,&local_68,
                 &(this->_solReal)._primal.val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar3].m_backend);
      local_d8.data._M_elems[0] = 0;
      local_d8.data._M_elems[1] = 0;
      tVar2 = boost::multiprecision::operator>
                        ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&local_118,(double *)&local_d8);
      if (tVar2) {
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                  (&sumviol->m_backend,&local_118);
        tVar2 = boost::multiprecision::operator>
                          ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&local_118,maxviol);
        if (tVar2) {
          *(ulong *)((maxviol->m_backend).data._M_elems + 8) =
               CONCAT35(local_118.data._M_elems[9]._1_3_,local_118.data._M_elems._32_5_);
          *(undefined8 *)((maxviol->m_backend).data._M_elems + 4) = local_118.data._M_elems._16_8_;
          *(ulong *)((maxviol->m_backend).data._M_elems + 6) =
               CONCAT35(local_118.data._M_elems[7]._1_3_,local_118.data._M_elems._24_5_);
          *(undefined8 *)(maxviol->m_backend).data._M_elems = local_118.data._M_elems._0_8_;
          *(undefined8 *)((maxviol->m_backend).data._M_elems + 2) = local_118.data._M_elems._8_8_;
          (maxviol->m_backend).exp = local_118.exp;
          (maxviol->m_backend).neg = local_118.neg;
          (maxviol->m_backend).fpclass = local_118.fpclass;
          (maxviol->m_backend).prec_elem = local_118.prec_elem;
        }
      }
      local_d8.fpclass = cpp_dec_float_finite;
      local_d8.prec_elem = 10;
      local_d8.data._M_elems[0] = 0;
      local_d8.data._M_elems[1] = 0;
      local_d8.data._M_elems[2] = 0;
      local_d8.data._M_elems[3] = 0;
      local_d8.data._M_elems[4] = 0;
      local_d8.data._M_elems[5] = 0;
      local_d8.data._M_elems._24_5_ = 0;
      local_d8.data._M_elems[7]._1_3_ = 0;
      local_d8.data._M_elems._32_5_ = 0;
      local_d8.data._M_elems[9]._1_3_ = 0;
      local_d8.exp = 0;
      local_d8.neg = false;
      boost::multiprecision::default_ops::
      eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                (&local_d8,
                 &(this->_solReal)._primal.val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar3].m_backend,&local_a0);
      local_118.data._M_elems._32_5_ = local_d8.data._M_elems._32_5_;
      local_118.data._M_elems[9]._1_3_ = local_d8.data._M_elems[9]._1_3_;
      local_118.data._M_elems[4] = local_d8.data._M_elems[4];
      local_118.data._M_elems[5] = local_d8.data._M_elems[5];
      local_118.data._M_elems._24_5_ = local_d8.data._M_elems._24_5_;
      local_118.data._M_elems[7]._1_3_ = local_d8.data._M_elems[7]._1_3_;
      local_118.data._M_elems[0] = local_d8.data._M_elems[0];
      local_118.data._M_elems[1] = local_d8.data._M_elems[1];
      local_118.data._M_elems[2] = local_d8.data._M_elems[2];
      local_118.data._M_elems[3] = local_d8.data._M_elems[3];
      local_118.exp = local_d8.exp;
      local_118.neg = local_d8.neg;
      local_118.fpclass = local_d8.fpclass;
      local_118.prec_elem = local_d8.prec_elem;
      local_d8.data._M_elems[0] = 0;
      local_d8.data._M_elems[1] = 0;
      tVar2 = boost::multiprecision::operator>
                        ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&local_118,(double *)&local_d8);
      uVar4 = local_e0;
      if (tVar2) {
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                  (&sumviol->m_backend,&local_118);
        tVar2 = boost::multiprecision::operator>
                          ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&local_118,maxviol);
        uVar4 = local_e0;
        if (tVar2) {
          *(ulong *)((maxviol->m_backend).data._M_elems + 8) =
               CONCAT35(local_118.data._M_elems[9]._1_3_,local_118.data._M_elems._32_5_);
          *(undefined8 *)((maxviol->m_backend).data._M_elems + 4) = local_118.data._M_elems._16_8_;
          *(ulong *)((maxviol->m_backend).data._M_elems + 6) =
               CONCAT35(local_118.data._M_elems[7]._1_3_,local_118.data._M_elems._24_5_);
          *(undefined8 *)(maxviol->m_backend).data._M_elems = local_118.data._M_elems._0_8_;
          *(undefined8 *)((maxviol->m_backend).data._M_elems + 2) = local_118.data._M_elems._8_8_;
          (maxviol->m_backend).exp = local_118.exp;
          (maxviol->m_backend).neg = local_118.neg;
          (maxviol->m_backend).fpclass = local_118.fpclass;
          (maxviol->m_backend).prec_elem = local_118.prec_elem;
        }
      }
    }
  }
  return bVar1;
}

Assistant:

bool SoPlexBase<R>::getBoundViolation(R& maxviol, R& sumviol)
{
   if(!isPrimalFeasible())
      return false;

   _syncRealSolution();
   VectorBase<R>& primal = _solReal._primal;
   assert(primal.dim() == numCols());

   maxviol = 0.0;
   sumviol = 0.0;

   for(int i = numCols() - 1; i >= 0; i--)
   {
      R lower = _realLP->lowerUnscaled(i);
      R upper = _realLP->upperUnscaled(i);
      R viol = lower - primal[i];

      if(viol > 0.0)
      {
         sumviol += viol;

         if(viol > maxviol)
            maxviol = viol;
      }

      viol = primal[i] - upper;

      if(viol > 0.0)
      {
         sumviol += viol;

         if(viol > maxviol)
            maxviol = viol;
      }
   }

   return true;
}